

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

ImageChannelValues * __thiscall
pbrt::Image::MSE(ImageChannelValues *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,
                Image *ref,Image *mseImage)

{
  size_t sVar1;
  float fVar2;
  ImageChannelDesc *pIVar3;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar4;
  int iVar5;
  Allocator alloc;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar9;
  ulong uVar10;
  Image *pIVar11;
  size_t sVar12;
  long lVar13;
  Point2i PVar14;
  Tuple2<pbrt::Point2,_int> TVar15;
  ulong uVar16;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  allocator_type local_181;
  ImageChannelDesc *local_180;
  Image *local_178;
  long local_170;
  Image *local_168;
  vector<double,_std::allocator<double>_> sumSE;
  Point2i vb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_118;
  Image *local_110;
  ulong local_108;
  Point2i va;
  int local_f8;
  undefined4 uStack_f4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  ColorEncodingHandle local_d0;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_c8;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_a8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_88;
  ColorEncodingHandle local_68;
  ImageChannelDesc refDesc;
  
  va.super_Tuple2<pbrt::Point2,_int>.x = 0;
  va.super_Tuple2<pbrt::Point2,_int>.y = 0;
  local_178 = mseImage;
  std::vector<double,_std::allocator<double>_>::vector
            (&sumSE,(desc->offset).nStored,(value_type_conflict3 *)&va,(allocator_type *)&refDesc);
  local_180 = desc;
  ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&va,this,desc);
  requestedChannels.n = CONCAT44(uStack_f4,local_f8) - (long)va.super_Tuple2<pbrt::Point2,_int> >> 5
  ;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       va.super_Tuple2<pbrt::Point2,_int>;
  GetChannelDesc(&refDesc,ref,requestedChannels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&va);
  if (refDesc.offset.nStored == 0) {
    ChannelNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&va,this,local_180);
    ErrorExit<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ("Channels not found in image: %s",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&va);
  }
  TVar15 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  vb.super_Tuple2<pbrt::Point2,_int> = (ref->resolution).super_Tuple2<pbrt::Point2,_int>;
  va.super_Tuple2<pbrt::Point2,_int> = TVar15;
  if ((TVar15.x == vb.super_Tuple2<pbrt::Point2,_int>.x) &&
     (iVar5 = TVar15.y, iVar5 == vb.super_Tuple2<pbrt::Point2,_int>.y)) {
    local_168 = this;
    local_118 = &__return_storage_ptr__->
                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>;
    local_110 = ref;
    if (local_178 != (Image *)0x0) {
      pbVar8 = (this->channelNames).ptr;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<std::__cxx11::string_const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vb,pbVar8,
                 pbVar8 + (this->channelNames).nStored,&local_181);
      PVar14.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int>;
      local_68.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      lVar13 = (long)local_140 - (long)vb.super_Tuple2<pbrt::Point2,_int>;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar13 >> 5;
      channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     PVar14.super_Tuple2<pbrt::Point2,_int>;
      Image((Image *)&va,Float,(Point2i)TVar15,channels,&local_68,alloc);
      pIVar11 = local_178;
      (local_178->resolution).super_Tuple2<pbrt::Point2,_int>.y = local_f8;
      local_178->format = va.super_Tuple2<pbrt::Point2,_int>.x;
      (local_178->resolution).super_Tuple2<pbrt::Point2,_int>.x =
           va.super_Tuple2<pbrt::Point2,_int>.y;
      pstd::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_178->channelNames,&local_f0);
      (pIVar11->encoding).
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (uintptr_t)
              local_d0.
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (&pIVar11->p8,&local_c8);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                (&pIVar11->p16,&local_a8);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&pIVar11->p32,&local_88);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_88);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_a8);
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                (&local_c8);
      pstd::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vb);
      TVar15 = (local_168->resolution).super_Tuple2<pbrt::Point2,_int>;
      iVar5 = TVar15.y;
    }
    pIVar11 = local_168;
    if (0 < iVar5) {
      local_170 = 0;
      do {
        if (0 < TVar15.x) {
          uVar16 = 0;
          local_108 = local_170 << 0x20;
          do {
            pIVar3 = local_180;
            PVar14.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_108 | uVar16)
            ;
            GetChannels((ImageChannelValues *)&va,pIVar11,PVar14,local_180,(WrapMode2D)0x200000002);
            GetChannels((ImageChannelValues *)&vb,local_110,PVar14,&refDesc,(WrapMode2D)0x200000002)
            ;
            uVar6 = (pIVar3->offset).nStored;
            if (uVar6 != 0) {
              uVar10 = 0;
              do {
                pvVar7 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(uStack_f4,local_f8);
                if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(uStack_f4,local_f8) ==
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0) {
                  pvVar7 = &local_f0;
                }
                pbVar8 = local_140;
                if (local_140 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pbVar8 = &local_138;
                }
                fVar2 = *(float *)((long)&(pvVar7->alloc).memoryResource + uVar10 * 4) -
                        *(float *)((long)&(pbVar8->_M_dataplus)._M_p + uVar10 * 4);
                fVar2 = fVar2 * fVar2;
                if (ABS(fVar2) != INFINITY) {
                  sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10] =
                       (double)fVar2 +
                       sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10];
                  if (local_178 != (Image *)0x0) {
                    SetChannel(local_178,PVar14,(int)uVar10,fVar2);
                    uVar6 = (local_180->offset).nStored;
                  }
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 < uVar6);
            }
            InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                      ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&vb);
            InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                      ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&va);
            uVar16 = uVar16 + 1;
            TVar15 = (local_168->resolution).super_Tuple2<pbrt::Point2,_int>;
            pIVar11 = local_168;
          } while ((long)uVar16 < (long)TVar15.x);
        }
        local_170 = local_170 + 1;
      } while (local_170 < (long)TVar15 >> 0x20);
    }
    pIVar3 = local_180;
    sVar1 = (local_180->offset).nStored;
    vb.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int> & 0xffffffff00000000;
    va.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pstd::pmr::new_delete_resource()
    ;
    pIVar4 = local_118;
    InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
              (local_118,sVar1,(float *)&vb,(polymorphic_allocator<float> *)&va);
    sVar1 = (pIVar3->offset).nStored;
    if (sVar1 != 0) {
      paVar9 = &pIVar4->field_2;
      if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)pIVar4->ptr !=
          (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)0x0) {
        paVar9 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)pIVar4->ptr;
      }
      sVar12 = 0;
      do {
        TVar15 = (pIVar11->resolution).super_Tuple2<pbrt::Point2,_int>;
        paVar9->fixed[sVar12] =
             (float)(sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar12] / (double)(TVar15.y * TVar15.x));
        sVar12 = sVar12 + 1;
      } while (sVar1 != sVar12);
    }
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&refDesc.offset);
    if (sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return (ImageChannelValues *)pIVar4;
  }
  LogFatal<char_const(&)[13],char_const(&)[17],char_const(&)[13],pbrt::Point2<int>&,char_const(&)[17],pbrt::Point2<int>&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
             ,0x223,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])0x459e01,
             (char (*) [17])"ref.Resolution()",(char (*) [13])0x459e01,(Point2<int> *)&va,
             (char (*) [17])"ref.Resolution()",&vb);
}

Assistant:

ImageChannelValues Image::MSE(const ImageChannelDesc &desc, const Image &ref,
                              Image *mseImage) const {
    std::vector<double> sumSE(desc.size(), 0.);

    ImageChannelDesc refDesc = ref.GetChannelDesc(ChannelNames(desc));
    if (!refDesc)
        ErrorExit("Channels not found in image: %s", ChannelNames(desc));

    CHECK_EQ(Resolution(), ref.Resolution());

    if (mseImage)
        *mseImage = Image(PixelFormat::Float, Resolution(), ChannelNames());

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            ImageChannelValues vref = ref.GetChannels({x, y}, refDesc);

            for (int c = 0; c < desc.size(); ++c) {
                Float se = Sqr(v[c] - vref[c]);
                if (std::isinf(se))
                    continue;
                sumSE[c] += se;
                if (mseImage)
                    mseImage->SetChannel({x, y}, c, se);
            }
        }

    ImageChannelValues mse(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        mse[c] = sumSE[c] / (Resolution().x * Resolution().y);
    return mse;
}